

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int x509_check_time(mbedtls_x509_time *before,mbedtls_x509_time *after)

{
  mbedtls_x509_time *after_local;
  mbedtls_x509_time *before_local;
  
  if (after->year < before->year) {
    before_local._4_4_ = 1;
  }
  else if ((before->year == after->year) && (after->mon < before->mon)) {
    before_local._4_4_ = 1;
  }
  else if ((before->year == after->year) &&
          ((before->mon == after->mon && (after->day < before->day)))) {
    before_local._4_4_ = 1;
  }
  else if ((before->year == after->year) &&
          (((before->mon == after->mon && (before->day == after->day)) &&
           (after->hour < before->hour)))) {
    before_local._4_4_ = 1;
  }
  else if (((before->year == after->year) && (before->mon == after->mon)) &&
          ((before->day == after->day &&
           ((before->hour == after->hour && (after->min < before->min)))))) {
    before_local._4_4_ = 1;
  }
  else if ((before->year == after->year) &&
          ((((before->mon == after->mon && (before->day == after->day)) &&
            (before->hour == after->hour)) &&
           ((before->min == after->min && (after->sec < before->sec)))))) {
    before_local._4_4_ = 1;
  }
  else {
    before_local._4_4_ = 0;
  }
  return before_local._4_4_;
}

Assistant:

static int x509_check_time( const mbedtls_x509_time *before, const mbedtls_x509_time *after )
{
    if( before->year  > after->year )
        return( 1 );

    if( before->year == after->year &&
        before->mon   > after->mon )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day   > after->day )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day  == after->day  &&
        before->hour  > after->hour )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day  == after->day  &&
        before->hour == after->hour &&
        before->min   > after->min  )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day  == after->day  &&
        before->hour == after->hour &&
        before->min  == after->min  &&
        before->sec   > after->sec  )
        return( 1 );

    return( 0 );
}